

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec2 __thiscall djb::microfacet::s2_to_u2(microfacet *this,vec3 *wo,vec3 *wi,void *user_args)

{
  vec2 vVar1;
  vec3 vVar2;
  vec3 local_98;
  vec3 local_88;
  undefined1 local_7c [8];
  args args;
  void *user_args_local;
  vec3 *wi_local;
  vec3 *wo_local;
  microfacet *this_local;
  
  args._68_8_ = user_args;
  if (wi->z < 0.0) {
    __assert_fail("wi.z >= 0 && \"invalid incident direction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                  ,0x5cf,
                  "virtual vec2 djb::microfacet::s2_to_u2(const vec3 &, const vec3 &, const void *) const"
                 );
  }
  if (user_args == (void *)0x0) {
    microfacet::args::standard();
  }
  else {
    memcpy(local_7c,user_args,0x4c);
  }
  vVar2 = s2_to_h2(this,wo,wi);
  local_98.z = vVar2.z;
  local_88.z = local_98.z;
  local_98._0_8_ = vVar2._0_8_;
  local_88.x = local_98.x;
  local_88.y = local_98.y;
  vVar1 = h2_to_u2(this,&local_88,wi,(args *)local_7c);
  return vVar1;
}

Assistant:

vec2
microfacet::s2_to_u2(
	const vec3 &wo, const vec3 &wi, const void *user_args
) const {
	DJB_ASSERT(wi.z >= 0 && "invalid incident direction");
	microfacet::args args =
		user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
		          : microfacet::args::standard();

	return h2_to_u2(s2_to_h2(wo, wi), wi, args);
}